

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O2

int __thiscall ncnn::Normalize::forward(Normalize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t _elemsize;
  void *pvVar1;
  void *pvVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  uint c;
  int q_1;
  int iVar5;
  int iVar6;
  uint _c;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  Mat square_sum_blob;
  Mat local_68;
  
  iVar6 = bottom_blob->w;
  iVar5 = bottom_blob->h;
  _c = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  Mat::create(top_blob,iVar6,iVar5,_c,_elemsize,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  uVar9 = iVar5 * iVar6;
  iVar6 = this->across_spatial;
  iVar5 = this->across_channel;
  if (iVar5 == 0 || iVar6 == 0) {
    if (iVar6 != 0 && iVar5 == 0) {
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      if ((int)_c < 1) {
        _c = 0;
      }
      for (c = 0; c != _c; c = c + 1) {
        Mat::channel(&square_sum_blob,bottom_blob,c);
        pvVar1 = square_sum_blob.data;
        Mat::~Mat(&square_sum_blob);
        Mat::channel(&square_sum_blob,top_blob,c);
        pvVar2 = square_sum_blob.data;
        Mat::~Mat(&square_sum_blob);
        auVar14 = ZEXT416((uint)this->eps);
        uVar3 = 0;
        auVar12 = extraout_XMM0;
        while( true ) {
          if (uVar9 == uVar3) break;
          fVar10 = *(float *)((long)pvVar1 + uVar3 * 4);
          fVar10 = fVar10 * fVar10;
          auVar12 = ZEXT416((uint)fVar10);
          auVar14._0_4_ = auVar14._0_4_ + fVar10;
          uVar3 = uVar3 + 1;
        }
        auVar12 = rsqrtss(auVar12,auVar14);
        fVar10 = auVar12._0_4_;
        uVar3 = 0;
        if (this->channel_shared == 0) {
          uVar3 = (ulong)c;
        }
        fVar11 = *(float *)((long)(this->scale_data).data + uVar3 * 4);
        for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
          *(float *)((long)pvVar2 + uVar3 * 4) =
               *(float *)((long)pvVar1 + uVar3 * 4) * fVar11 *
               fVar10 * -0.5 * (auVar14._0_4_ * fVar10 * fVar10 + -3.0);
        }
      }
      return 0;
    }
    if (iVar5 == 0 || iVar6 != 0) {
      return 0;
    }
    square_sum_blob.dims = 0;
    square_sum_blob.w = 0;
    square_sum_blob.h = 0;
    square_sum_blob.c = 0;
    square_sum_blob.elemsize = 0;
    square_sum_blob.allocator = (Allocator *)0x0;
    square_sum_blob.data = (void *)0x0;
    square_sum_blob.refcount = (int *)0x0;
    square_sum_blob.cstep = 0;
    Mat::create(&square_sum_blob,uVar9,_elemsize,opt->workspace_allocator);
    iVar6 = -100;
    if ((square_sum_blob.data != (void *)0x0) &&
       ((long)square_sum_blob.c * square_sum_blob.cstep != 0)) {
      if (this->channel_shared == 0) {
        uVar8 = 0;
        uVar3 = (ulong)_c;
        if ((int)_c < 1) {
          uVar3 = uVar8;
        }
        uVar7 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar7 = uVar8;
        }
        for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
          fVar10 = this->eps;
          fVar11 = fVar10;
          for (iVar6 = 0; (int)uVar3 != iVar6; iVar6 = iVar6 + 1) {
            Mat::channel(&local_68,bottom_blob,iVar6);
            pvVar1 = local_68.data;
            Mat::~Mat(&local_68);
            fVar10 = *(float *)((long)pvVar1 + uVar8 * 4);
            fVar10 = fVar10 * fVar10;
            fVar11 = fVar11 + fVar10;
          }
          auVar12 = rsqrtss(ZEXT416((uint)fVar10),ZEXT416((uint)fVar11));
          fVar10 = auVar12._0_4_;
          *(float *)((long)square_sum_blob.data + uVar8 * 4) =
               fVar10 * -0.5 * (fVar11 * fVar10 * fVar10 + -3.0);
        }
        iVar6 = 0;
        for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
          Mat::channel(&local_68,bottom_blob,(int)uVar8);
          pvVar1 = local_68.data;
          Mat::~Mat(&local_68);
          Mat::channel(&local_68,top_blob,(int)uVar8);
          pvVar2 = local_68.data;
          Mat::~Mat(&local_68);
          fVar10 = *(float *)((long)(this->scale_data).data + uVar8 * 4);
          for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
            *(float *)((long)pvVar2 + uVar4 * 4) =
                 *(float *)((long)pvVar1 + uVar4 * 4) * fVar10 *
                 *(float *)((long)square_sum_blob.data + uVar4 * 4);
          }
        }
      }
      else {
        uVar3 = 0;
        if ((int)_c < 1) {
          _c = 0;
        }
        uVar8 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar8 = uVar3;
        }
        fVar10 = *(this->scale_data).data;
        for (; uVar3 != uVar8; uVar3 = uVar3 + 1) {
          fVar11 = this->eps;
          fVar13 = fVar11;
          for (uVar9 = 0; _c != uVar9; uVar9 = uVar9 + 1) {
            Mat::channel(&local_68,bottom_blob,uVar9);
            pvVar1 = local_68.data;
            Mat::~Mat(&local_68);
            fVar11 = *(float *)((long)pvVar1 + uVar3 * 4);
            fVar11 = fVar11 * fVar11;
            fVar13 = fVar13 + fVar11;
          }
          auVar12 = rsqrtss(ZEXT416((uint)fVar11),ZEXT416((uint)fVar13));
          fVar11 = auVar12._0_4_;
          *(float *)((long)square_sum_blob.data + uVar3 * 4) =
               fVar11 * -0.5 * fVar10 * (fVar13 * fVar11 * fVar11 + -3.0);
        }
        iVar6 = 0;
        for (uVar9 = 0; uVar9 != _c; uVar9 = uVar9 + 1) {
          Mat::channel(&local_68,bottom_blob,uVar9);
          pvVar1 = local_68.data;
          Mat::~Mat(&local_68);
          Mat::channel(&local_68,top_blob,uVar9);
          pvVar2 = local_68.data;
          Mat::~Mat(&local_68);
          for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
            *(float *)((long)pvVar2 + uVar3 * 4) =
                 *(float *)((long)square_sum_blob.data + uVar3 * 4) *
                 *(float *)((long)pvVar1 + uVar3 * 4);
          }
        }
      }
    }
  }
  else {
    square_sum_blob.dims = 0;
    square_sum_blob.w = 0;
    square_sum_blob.h = 0;
    square_sum_blob.c = 0;
    square_sum_blob.elemsize = 0;
    square_sum_blob.allocator = (Allocator *)0x0;
    square_sum_blob.data = (void *)0x0;
    square_sum_blob.refcount = (int *)0x0;
    square_sum_blob.cstep = 0;
    Mat::create(&square_sum_blob,_c,_elemsize,opt->workspace_allocator);
    iVar6 = -100;
    if ((square_sum_blob.data != (void *)0x0) &&
       ((long)square_sum_blob.c * square_sum_blob.cstep != 0)) {
      uVar8 = 0;
      uVar3 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar3 = uVar8;
      }
      uVar7 = (ulong)_c;
      if ((int)_c < 1) {
        uVar7 = uVar8;
      }
      for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
        Mat::channel(&local_68,bottom_blob,(int)uVar8);
        pvVar1 = local_68.data;
        Mat::~Mat(&local_68);
        fVar10 = 0.0;
        for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
          fVar11 = *(float *)((long)pvVar1 + uVar4 * 4);
          fVar11 = fVar11 * fVar11;
          in_XMM1 = ZEXT416((uint)fVar11);
          fVar10 = fVar10 + fVar11;
        }
        *(float *)((long)square_sum_blob.data + uVar8 * 4) = fVar10;
      }
      auVar12 = ZEXT416((uint)this->eps);
      uVar8 = 0;
      while( true ) {
        if (uVar7 == uVar8) break;
        auVar12._0_4_ = auVar12._0_4_ + *(float *)((long)square_sum_blob.data + uVar8 * 4);
        uVar8 = uVar8 + 1;
      }
      auVar14 = rsqrtss(in_XMM1,auVar12);
      fVar10 = auVar14._0_4_;
      fVar10 = fVar10 * -0.5 * (auVar12._0_4_ * fVar10 * fVar10 + -3.0);
      if (this->channel_shared == 0) {
        iVar6 = 0;
        for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
          Mat::channel(&local_68,bottom_blob,(int)uVar8);
          pvVar1 = local_68.data;
          Mat::~Mat(&local_68);
          Mat::channel(&local_68,top_blob,(int)uVar8);
          pvVar2 = local_68.data;
          Mat::~Mat(&local_68);
          fVar11 = *(float *)((long)(this->scale_data).data + uVar8 * 4);
          for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
            *(float *)((long)pvVar2 + uVar4 * 4) =
                 *(float *)((long)pvVar1 + uVar4 * 4) * fVar11 * fVar10;
          }
        }
      }
      else {
        fVar11 = *(this->scale_data).data;
        iVar6 = 0;
        for (iVar5 = 0; iVar5 != (int)uVar7; iVar5 = iVar5 + 1) {
          Mat::channel(&local_68,bottom_blob,iVar5);
          pvVar1 = local_68.data;
          Mat::~Mat(&local_68);
          Mat::channel(&local_68,top_blob,iVar5);
          pvVar2 = local_68.data;
          Mat::~Mat(&local_68);
          for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)pvVar2 + uVar8 * 4) =
                 *(float *)((long)pvVar1 + uVar8 * 4) * fVar10 * fVar11;
          }
        }
      }
    }
  }
  Mat::~Mat(&square_sum_blob);
  return iVar6;
}

Assistant:

int Normalize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        // sum + eps
        float ssum = eps;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        // 1 / sqrt(ssum)
        float a = 1.f / sqrt(ssum);

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            float ssum = eps;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a = 1.f / sqrt(ssum);
            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum) * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}